

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O2

void __thiscall fixedMeasurement_invalid_Test::TestBody(fixedMeasurement_invalid_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper local_a0;
  fixed_measurement iv5;
  fixed_measurement iv4;
  AssertionResult gtest_ar__8;
  string local_68;
  AssertHelper local_48;
  fixed_measurement iv3;
  fixed_measurement iv2;
  fixed_measurement iv1;
  
  iv1.value_ = 1.2;
  iv1.units_.multiplier_ = NAN;
  iv1.units_.base_units_ = (unit_data)0xfa94a488;
  bVar1 = units::is_valid(&iv1);
  iv2.value_ = (double)CONCAT71(iv2.value_._1_7_,!bVar1);
  iv2.units_.multiplier_ = 0.0;
  iv2.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&iv3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv2,(AssertionResult *)"is_valid(iv1)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iv4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1bd,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iv4,(Message *)&iv3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iv4);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv3.value_ != 0.0) {
      (**(code **)(*(long *)iv3.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv2.units_);
  bVar1 = units::isnormal(&iv1);
  iv2.value_ = (double)CONCAT71(iv2.value_._1_7_,!bVar1);
  iv2.units_.multiplier_ = 0.0;
  iv2.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&iv3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv2,(AssertionResult *)"isnormal(iv1)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iv4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1be,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iv4,(Message *)&iv3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iv4);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv3.value_ != 0.0) {
      (**(code **)(*(long *)iv3.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv2.units_);
  iv2.value_ = NAN;
  iv2.units_ = (unit)&DAT_13f800000;
  bVar1 = units::is_valid(&iv2);
  iv3.value_ = (double)CONCAT71(iv3.value_._1_7_,!bVar1);
  iv3.units_.multiplier_ = 0.0;
  iv3.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&iv4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv3,(AssertionResult *)"is_valid(iv2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iv5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c1,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iv5,(Message *)&iv4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iv5);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv4.value_ != 0.0) {
      (**(code **)(*(long *)iv4.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv3.units_);
  bVar1 = units::isnormal(&iv2);
  iv3.value_ = (double)CONCAT71(iv3.value_._1_7_,!bVar1);
  iv3.units_.multiplier_ = 0.0;
  iv3.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&iv4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv3,(AssertionResult *)"isnormal(iv2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&iv5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c2,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&iv5,(Message *)&iv4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&iv5);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv4.value_ != 0.0) {
      (**(code **)(*(long *)iv4.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv3.units_);
  iv3.value_ = INFINITY;
  iv3.units_ = (unit)&DAT_13f800000;
  bVar1 = units::is_valid(&iv3);
  iv4.value_ = (double)CONCAT71(iv4.value_._1_7_,bVar1);
  iv4.units_.multiplier_ = 0.0;
  iv4.units_.base_units_ = (unit_data)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&iv5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv4,(AssertionResult *)"is_valid(iv3)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c5,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8,(Message *)&iv5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv5.value_ != 0.0) {
      (**(code **)(*(long *)iv5.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv4.units_);
  bVar1 = units::isnormal(&iv3);
  iv4.value_ = (double)CONCAT71(iv4.value_._1_7_,!bVar1);
  iv4.units_.multiplier_ = 0.0;
  iv4.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&iv5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv4,(AssertionResult *)"isnormal(iv3)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c6,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__8,(Message *)&iv5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__8);
    std::__cxx11::string::~string((string *)&local_68);
    if (iv5.value_ != 0.0) {
      (**(code **)(*(long *)iv5.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv4.units_);
  iv4.value_ = 9.99999999999948e-312;
  iv4.units_ = (unit)&DAT_13f800000;
  bVar1 = units::is_valid(&iv4);
  iv5.value_ = (double)CONCAT71(iv5.value_._1_7_,bVar1);
  iv5.units_.multiplier_ = 0.0;
  iv5.units_.base_units_ = (unit_data)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv5,(AssertionResult *)"is_valid(iv4)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1c9,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv5.units_);
  bVar1 = units::isnormal(&iv4);
  iv5.value_ = (double)CONCAT71(iv5.value_._1_7_,!bVar1);
  iv5.units_.multiplier_ = 0.0;
  iv5.units_.base_units_ = (unit_data)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&iv5,(AssertionResult *)"isnormal(iv4)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1ca,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar__8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    if ((long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__8._1_7_,gtest_ar__8.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&iv5.units_);
  iv5.value_ = 0.0;
  iv5.units_ = (unit)&DAT_13f800000;
  gtest_ar__8.success_ = units::is_valid(&iv5);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__8.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar__8,(AssertionResult *)"is_valid(iv5)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1cd,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__8.message_);
  gtest_ar__8.success_ = units::isnormal(&iv5);
  gtest_ar__8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__8.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&gtest_ar__8,(AssertionResult *)"isnormal(iv5)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x1ce,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_a0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_a0.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__8.message_);
  return;
}

Assistant:

TEST(fixedMeasurement, invalid)
{
    fixed_measurement iv1(1.2, invalid);
    EXPECT_FALSE(is_valid(iv1));
    EXPECT_FALSE(isnormal(iv1));

    fixed_measurement iv2(constants::invalid_conversion, m);
    EXPECT_FALSE(is_valid(iv2));
    EXPECT_FALSE(isnormal(iv2));

    fixed_measurement iv3(constants::infinity, m);
    EXPECT_TRUE(is_valid(iv3));
    EXPECT_FALSE(isnormal(iv3));

    fixed_measurement iv4(1e-311, m);  // subnormal
    EXPECT_TRUE(is_valid(iv4));
    EXPECT_FALSE(isnormal(iv4));

    fixed_measurement iv5(0.0, m);
    EXPECT_TRUE(is_valid(iv5));
    EXPECT_TRUE(isnormal(iv5));
}